

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

int fmt::v9::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  ulong uVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  basic_fp<unsigned___int128> value_00;
  buffer<char> *buf_00;
  result rVar6;
  long lVar7;
  decimal_fp<float> dVar8;
  format_error *this;
  byte bVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint64_t error;
  ulong uVar14;
  char cVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  decimal_fp<double> dVar20;
  int exp;
  gen_digits_handler handler;
  int local_c4;
  double local_c0;
  gen_digits_handler local_b8;
  ulong local_a0;
  uint64_t local_98;
  int local_8c;
  buffer<char> *local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  undefined8 uStack_50;
  int local_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  
  uVar14 = (ulong)(uint)precision;
  local_80 = (ulong)specs & 0xff00000000;
  local_b8.fixed = local_80 == 0x200000000;
  local_c0 = value;
  if (value <= 0.0) {
    if (0 < precision && local_80 == 0x200000000) {
      if (buf->capacity_ < uVar14) {
        (**buf->_vptr_buffer)(buf,uVar14);
      }
      uVar18 = buf->capacity_;
      if (uVar14 <= buf->capacity_) {
        uVar18 = uVar14;
      }
      buf->size_ = uVar18;
      memset(buf->ptr_,0x30,uVar14);
      return -precision;
    }
    if (buf->capacity_ < buf->size_ + 1) {
      (**buf->_vptr_buffer)(buf);
    }
    sVar2 = buf->size_;
    buf->size_ = sVar2 + 1;
    buf->ptr_[sVar2] = '0';
    return 0;
  }
  local_60 = (ulong)specs >> 0x20;
  local_c4 = 0;
  if (precision < 0) {
    if ((specs._4_4_ >> 0x12 & 1) == 0) {
      dVar20 = dragonbox::to_decimal<double>(value);
      write<char,_fmt::v9::appender,_unsigned_long,_0>((appender)buf,dVar20.significand);
      return dVar20.exponent;
    }
    dVar8 = dragonbox::to_decimal<float>((float)value);
    write<char,_fmt::v9::appender,_unsigned_int,_0>((appender)buf,dVar8.significand);
    return dVar8.exponent;
  }
  local_70 = (ulong)value & 0x7ff0000000000000;
  local_78 = (ulong)value & 0xfffffffffffff;
  iVar11 = (uint)(local_70 >> 0x34) - 0x433;
  uVar18 = local_78 + 0x10000000000000;
  if (local_70 == 0) {
    uVar18 = local_78;
  }
  local_8c = iVar11;
  if (local_70 == 0) {
    lVar7 = 0x3f;
    if (local_78 != 0) {
      for (; local_78 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    uVar18 = uVar18 << (~(byte)lVar7 + 0x35 & 0x3f);
    iVar11 = -0x427 - ((uint)lVar7 ^ 0x3f);
    local_8c = -0x432;
  }
  iVar5 = (int)((ulong)((long)(-0x32 - iVar11) * 0x4d104d42 + 0xffffffff) >> 0x20);
  uVar12 = iVar5 + 0x15b;
  uVar13 = iVar5 + 0x162;
  if (-1 < (int)uVar12) {
    uVar13 = uVar12;
  }
  local_68 = (ulong)(uVar13 & 0xfffffff8);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar18 << 0xb;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = basic_data<void>::pow10_significands[(long)((int)uVar13 >> 3) + 1];
  uVar18 = SUB168(auVar3 * auVar4,8) - (SUB168(auVar3 * auVar4,0) >> 0x3f);
  bVar9 = -((char)basic_data<void>::pow10_exponents[(long)((int)uVar13 >> 3) + 1] + (char)iVar11) -
          0x35;
  local_98 = 1L << (bVar9 & 0x3f);
  local_b8.exp10 = 0x154 - (uVar13 & 0xfffffff8);
  uVar19 = uVar18 >> (bVar9 & 0x3f);
  uVar12 = (uint)uVar19 | 1;
  uVar13 = 0x1f;
  if (uVar12 != 0) {
    for (; uVar12 >> uVar13 == 0; uVar13 = uVar13 - 1) {
    }
  }
  lVar7 = (uVar19 & 0xffffffff) +
          *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar13 * 8);
  local_b8.buf = buf->ptr_;
  local_b8.size = 0;
  local_c4 = (int)((ulong)lVar7 >> 0x20);
  local_b8.precision = precision;
  local_a0 = uVar14;
  local_88 = buf;
  if (local_80 == 0x200000000) {
    uVar13 = local_b8.exp10 + local_c4;
    if ((int)(uVar13 ^ 0x7fffffff) < precision && 0 < (int)uVar13) {
      this = (format_error *)__cxa_allocate_exception(0x10);
      format_error::format_error(this,"number is too big");
      __cxa_throw(this,&format_error::typeinfo,format_error::~format_error);
    }
    local_b8.precision = uVar13 + precision;
    if (local_b8.precision == 0 || SCARRY4(uVar13,precision) != local_b8.precision < 0) {
      iVar11 = 1;
      if (local_b8.precision < 0) goto LAB_0012bcd9;
      lVar7 = basic_data<void>::power_of_10_64[lVar7 + -0x100000000 >> 0x20] << (bVar9 & 0x3f);
      uVar14 = uVar18 / 10;
      if ((lVar7 - uVar14 < uVar14) || (lVar7 + uVar14 * -2 < 0x14)) {
        if ((99 < uVar18) && (lVar7 - (uVar14 - 10) <= uVar14 - 10)) {
          cVar15 = '1';
          goto LAB_0012bf67;
        }
        cVar15 = '0';
        bVar10 = true;
      }
      else {
        cVar15 = '0';
LAB_0012bf67:
        bVar10 = false;
      }
      iVar11 = 2;
      if (!bVar10) {
        local_b8.size = 1;
        *local_b8.buf = cVar15;
        iVar11 = 1;
      }
      goto LAB_0012bcd9;
    }
  }
  uVar1 = local_98 - 1;
  uVar18 = uVar18 & uVar1;
  do {
    lVar7 = (long)local_c4;
    switch(local_c4) {
    case 1:
      cVar15 = (char)uVar19;
      uVar19 = 0;
      goto LAB_0012bc29;
    case 2:
      cVar15 = (char)((uVar19 & 0xffffffff) / 10);
      iVar11 = (int)((uVar19 & 0xffffffff) / 10) * 10;
      break;
    case 3:
      cVar15 = (char)((uVar19 & 0xffffffff) / 100);
      iVar11 = (int)((uVar19 & 0xffffffff) / 100) * 100;
      break;
    case 4:
      cVar15 = (char)((uVar19 & 0xffffffff) / 1000);
      iVar11 = (int)((uVar19 & 0xffffffff) / 1000) * 1000;
      break;
    case 5:
      cVar15 = (char)((uVar19 & 0xffffffff) / 10000);
      iVar11 = (int)((uVar19 & 0xffffffff) / 10000) * 10000;
      break;
    case 6:
      uVar17 = uVar19 >> 5 & 0x7ffffff;
      cVar15 = (char)(uVar17 / 0xc35);
      iVar11 = (int)(uVar17 / 0xc35) * 100000;
      break;
    case 7:
      cVar15 = (char)((uVar19 & 0xffffffff) / 1000000);
      iVar11 = (int)((uVar19 & 0xffffffff) / 1000000) * 1000000;
      break;
    case 8:
      cVar15 = (char)((uVar19 & 0xffffffff) / 10000000);
      iVar11 = (int)((uVar19 & 0xffffffff) / 10000000) * 10000000;
      break;
    case 9:
      cVar15 = (char)((uVar19 & 0xffffffff) / 100000000);
      iVar11 = (int)((uVar19 & 0xffffffff) / 100000000) * 100000000;
      break;
    case 10:
      uVar17 = (uVar19 >> 9 & 0x7fffff) * 0x44b83;
      cVar15 = (char)(uVar17 >> 0x27);
      iVar11 = (uint)(uVar17 >> 0x27) * 1000000000;
      break;
    default:
      cVar15 = '\0';
      goto LAB_0012bc29;
    }
    uVar19 = (ulong)(uint)((int)uVar19 - iVar11);
LAB_0012bc29:
    local_c4 = local_c4 + -1;
    rVar6 = gen_digits_handler::on_digit
                      (&local_b8,cVar15 + '0',
                       *(long *)(basic_data<void>::pow10_exponents + lVar7 * 4 + 0x54) <<
                       (bVar9 & 0x3f),((uVar19 & 0xffffffff) << (bVar9 & 0x3f)) + uVar18,1,true);
    if (rVar6 != more) {
      uVar14 = (ulong)rVar6;
    }
    iVar11 = (int)uVar14;
    if (rVar6 != more) goto LAB_0012bcd9;
  } while (0 < local_c4);
  error = 1;
  do {
    uVar19 = uVar18 * 10;
    error = error * 10;
    uVar18 = uVar19 & uVar1;
    local_c4 = local_c4 + -1;
    rVar6 = gen_digits_handler::on_digit
                      (&local_b8,(char)(uVar19 >> (bVar9 & 0x3f)) + '0',local_98,uVar18,error,false)
    ;
    if (rVar6 != more) {
      uVar14 = (ulong)rVar6;
    }
    iVar11 = (int)uVar14;
  } while (rVar6 == more);
LAB_0012bcd9:
  buf_00 = local_88;
  if (iVar11 == 2) {
    local_a0 = (ulong)(uint)local_b8.precision;
    local_c4 = local_c4 + (local_b8.size - ((int)local_68 + 8)) + 0x15b;
  }
  else {
    local_c4 = local_c4 + local_b8.exp10;
    uVar14 = (ulong)(uint)local_b8.size;
    if (local_88->capacity_ < uVar14) {
      (**local_88->_vptr_buffer)(local_88,uVar14);
    }
    if (buf_00->capacity_ < uVar14) {
      uVar14 = buf_00->capacity_;
    }
    buf_00->size_ = uVar14;
  }
  uVar13 = (uint)local_60;
  if (iVar11 == 2) {
    if ((uVar13 >> 0x12 & 1) == 0) {
      local_58 = local_78 | 0x10000000000000;
      if (local_70 == 0) {
        local_58 = local_78;
      }
      bVar10 = local_70 >> 0x35 != 0 && local_78 == 0;
      local_48 = local_8c;
    }
    else {
      uVar16 = (uint)(float)local_c0 & 0x7fffff;
      uVar12 = (uint)(float)local_c0 & 0x7f800000;
      local_58 = (ulong)uVar16 + 0x800000;
      if (uVar12 == 0) {
        local_58 = (ulong)uVar16;
      }
      local_48 = -0x95;
      if (uVar12 != 0) {
        local_48 = (uVar12 >> 0x17) - 0x96;
      }
      bVar10 = 0xffffff < uVar12 && uVar16 == 0;
    }
    uVar12 = bVar10 + 4;
    if (local_80 != 0x200000000) {
      uVar12 = (uint)bVar10;
    }
    iVar11 = 0x2ff;
    if ((int)local_a0 < 0x2ff) {
      iVar11 = (int)local_a0;
    }
    uStack_50 = 0;
    value_00._20_4_ = uStack_44;
    value_00.e = local_48;
    value_00.f._8_8_ = 0;
    value_00.f._0_8_ = local_58;
    value_00._24_8_ = uStack_40;
    format_dragon(value_00,uVar12,iVar11,buf_00,&local_c4);
  }
  if ((uVar13 >> 0x13 & 1) == 0 && local_80 != 0x200000000) {
    uVar14 = buf_00->size_;
    if (uVar14 != 0) {
      do {
        iVar11 = local_c4 + 1;
        if (buf_00->ptr_[uVar14 - 1] != '0') goto LAB_0012beb3;
        uVar14 = uVar14 - 1;
        local_c4 = iVar11;
      } while (uVar14 != 0);
      uVar14 = 0;
    }
LAB_0012beb3:
    if (buf_00->capacity_ < uVar14) {
      (**buf_00->_vptr_buffer)(buf_00,uVar14);
    }
    if (buf_00->capacity_ < uVar14) {
      uVar14 = buf_00->capacity_;
    }
    buf_00->size_ = uVar14;
  }
  return local_c4;
}

Assistant:

FMT_CONSTEXPR20 auto format_float(Float value, int precision, float_specs specs,
                                  buffer<char>& buf) -> int {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");
  auto converted_value = convert_float(value);

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  int exp = 0;
  bool use_dragon = true;
  unsigned dragon_flags = 0;
  if (!is_fast_float<Float>()) {
    const auto inv_log2_10 = 0.3010299956639812;  // 1 / log2(10)
    using info = dragonbox::float_info<decltype(converted_value)>;
    const auto f = basic_fp<typename info::carrier_uint>(converted_value);
    // Compute exp, an approximate power of 10, such that
    //   10^(exp - 1) <= value < 10^exp or 10^exp <= value < 10^(exp + 1).
    // This is based on log10(value) == log2(value) / log2(10) and approximation
    // of log2(value) by e + num_fraction_bits idea from double-conversion.
    exp = static_cast<int>(
        std::ceil((f.e + count_digits<1>(f.f) - 1) * inv_log2_10 - 1e-10));
    dragon_flags = dragon::fixup;
  } else if (!is_constant_evaluated() && precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  } else {
    // Use Grisu + Dragon4 for the given precision:
    // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
    const int min_exp = -60;  // alpha in Grisu.
    int cached_exp10 = 0;     // K in Grisu.
    fp normalized = normalize(fp(converted_value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::num_significand_bits), cached_exp10);
    normalized = normalized * cached_pow;
    gen_digits_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) != digits::error &&
        !is_constant_evaluated()) {
      exp += handler.exp10;
      buf.try_resize(to_unsigned(handler.size));
      use_dragon = false;
    } else {
      exp += handler.size - cached_exp10 - 1;
      precision = handler.precision;
    }
  }
  if (use_dragon) {
    auto f = basic_fp<uint128_t>();
    bool is_predecessor_closer = specs.binary32
                                     ? f.assign(static_cast<float>(value))
                                     : f.assign(converted_value);
    if (is_predecessor_closer) dragon_flags |= dragon::predecessor_closer;
    if (fixed) dragon_flags |= dragon::fixed;
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, dragon_flags, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}